

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

int XPMP2::SoundLoadXPSounds(void)

{
  char *pcVar1;
  int n;
  float in_stack_000000c8;
  float in_stack_000000cc;
  float in_stack_000000d0;
  float in_stack_000000d4;
  float in_stack_000000d8;
  bool in_stack_000000df;
  char *in_stack_000000e0;
  char *in_stack_000000e8;
  uint local_4;
  
  pcVar1 = XPMPSoundAdd(in_stack_000000e8,in_stack_000000e0,in_stack_000000df,in_stack_000000d8,
                        in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
  local_4 = (uint)(*pcVar1 == '\0');
  pcVar1 = XPMPSoundAdd(in_stack_000000e8,in_stack_000000e0,in_stack_000000df,in_stack_000000d8,
                        in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
  if (*pcVar1 == '\0') {
    local_4 = local_4 + 1;
  }
  pcVar1 = XPMPSoundAdd(in_stack_000000e8,in_stack_000000e0,in_stack_000000df,in_stack_000000d8,
                        in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
  if (*pcVar1 == '\0') {
    local_4 = local_4 + 1;
  }
  pcVar1 = XPMPSoundAdd(in_stack_000000e8,in_stack_000000e0,in_stack_000000df,in_stack_000000d8,
                        in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
  if (*pcVar1 == '\0') {
    local_4 = local_4 + 1;
  }
  pcVar1 = XPMPSoundAdd(in_stack_000000e8,in_stack_000000e0,in_stack_000000df,in_stack_000000d8,
                        in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
  if (*pcVar1 == '\0') {
    local_4 = local_4 + 1;
  }
  pcVar1 = XPMPSoundAdd(in_stack_000000e8,in_stack_000000e0,in_stack_000000df,in_stack_000000d8,
                        in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
  if (*pcVar1 == '\0') {
    local_4 = local_4 + 1;
  }
  pcVar1 = XPMPSoundAdd(in_stack_000000e8,in_stack_000000e0,in_stack_000000df,in_stack_000000d8,
                        in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
  if (*pcVar1 == '\0') {
    local_4 = local_4 + 1;
  }
  pcVar1 = XPMPSoundAdd(in_stack_000000e8,in_stack_000000e0,in_stack_000000df,in_stack_000000d8,
                        in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
  if (*pcVar1 == '\0') {
    local_4 = local_4 + 1;
  }
  pcVar1 = XPMPSoundAdd(in_stack_000000e8,in_stack_000000e0,in_stack_000000df,in_stack_000000d8,
                        in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
  if (*pcVar1 == '\0') {
    local_4 = local_4 + 1;
  }
  pcVar1 = XPMPSoundAdd(in_stack_000000e8,in_stack_000000e0,in_stack_000000df,in_stack_000000d8,
                        in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
  if (*pcVar1 == '\0') {
    local_4 = local_4 + 1;
  }
  return local_4;
}

Assistant:

int SoundLoadXPSounds ()
{
    int n = 0;
#define ADD_SND(s,f,l) if (!XPMPSoundAdd(s,f,l)[0]) ++n;
#define ADD_CONE(s,f,l,cd,cp,cia,coa,cov) if (!XPMPSoundAdd(s,f,l,cd,cp,cia,coa,cov)[0]) ++n;
    // Engine sounds
    ADD_SND(XP_SOUND_ELECTRIC,          "Resources/sounds/engine/ENGINE_ELECTRIC_out.wav",          true);
    // The two jet sounds define a sound cone: 180 degrees heading (ie. backwards), no pitch, with 30 degree inner angle (full sound), and 60 degree outer angle (reduced sound), with sound reduction to 50% outside the outer angle:
    ADD_CONE(XP_SOUND_HIBYPASSJET,      "Resources/sounds/engine/ENGINE_HI_BYPASS_JET_out.wav",     true, 180.0f, 0.0f, 30.0f, 60.0f, 0.5f);
    ADD_CONE(XP_SOUND_LOBYPASSJET,      "Resources/sounds/engine/ENGINE_LO_BYPASS_JET_out.wav",     true, 180.0f, 0.0f, 30.0f, 60.0f, 0.5f);
    ADD_SND(XP_SOUND_TURBOPROP,         "Resources/sounds/engine/ENGINE_TURBOPROP_out.wav",         true);
    ADD_SND(XP_SOUND_PROP_AIRPLANE,     "Resources/sounds/engine/PROPELLER_OF_AIRPLANE_out.wav",    true);
    ADD_SND(XP_SOUND_PROP_HELI,         "Resources/sounds/engine/PROPELLER_OF_HELO_out.wav",        true);
    ADD_SND(XP_SOUND_REVERSE_THRUST,    "Resources/sounds/engine/REVERSE_THRUST_out.wav",           true);
    
    // Rolling on the ground
    ADD_SND(XP_SOUND_ROLL_RUNWAY,       "Resources/sounds/contact/roll_runway.wav",                 true);
    
    // One-time sounds
    ADD_SND(XP_SOUND_FLAP,              "Resources/sounds/systems/flap.wav",                        false);
    ADD_SND(XP_SOUND_GEAR,              "Resources/sounds/systems/gear.wav",                        false);
    return n;
}